

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internals.h
# Opt level: O0

char * pybind11::detail::c_str<std::__cxx11::string>
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  internals *piVar1;
  char *pcVar2;
  forward_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *strings;
  internals *internals;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local;
  
  piVar1 = get_internals();
  std::forward_list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_front<std::__cxx11::string>
            ((forward_list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &piVar1->static_strings,args);
  std::
  forward_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::front(&piVar1->static_strings);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  return pcVar2;
}

Assistant:

const char *c_str(Args &&...args) {
    // GCC 4.8 doesn't like parameter unpack within lambda capture, so use
    // PYBIND11_LOCK_INTERNALS.
    auto &internals = get_internals();
    PYBIND11_LOCK_INTERNALS(internals);
    auto &strings = internals.static_strings;
    strings.emplace_front(std::forward<Args>(args)...);
    return strings.front().c_str();
}